

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

uint __thiscall Compiler::evaluateBracket(Compiler *this,string *originalLine)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  Parser *this_00;
  int iVar5;
  Scope *pSVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  Instruction op;
  uint uVar11;
  uint argCount;
  bool bVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __tmp;
  string *psVar13;
  int iVar14;
  string *psVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  string peiceBuffer;
  string line;
  allocator_type local_149;
  undefined1 local_148 [32];
  Compiler *local_128;
  Instruction local_11c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  InstructionGenerator *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  Parser *local_98;
  string *local_90;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar2 = (originalLine->_M_dataplus)._M_p;
  local_128 = this;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + originalLine->_M_string_length);
  Parser::extractBracketArguments(&local_b0,&this->parser,&local_68);
  psVar15 = local_b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar13 = local_b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    psVar15 = local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar13 = local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pbVar4 = local_b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      bVar12 = psVar15 !=
               local_b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar13, bVar12; psVar15 = psVar15 + 1) {
    while (*(psVar15->_M_dataplus)._M_p == ' ') {
      std::__cxx11::string::erase((ulong)psVar15,0);
    }
    std::__cxx11::string::replace((ulong)psVar15,0,(char *)0x0,0x110367);
    while ((psVar15->_M_dataplus)._M_p[psVar15->_M_string_length - 1] == ' ') {
      std::__cxx11::string::erase((ulong)psVar15,psVar15->_M_string_length - 1);
    }
    std::__cxx11::string::append((char *)psVar15);
    psVar13 = local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  }
  if (psVar13 !=
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_f8 = &local_128->igen;
    local_98 = &this->parser;
    do {
      this_00 = local_98;
      Parser::bracketOperatorFix(&local_88,local_98,psVar13 + -1);
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90 = psVar13 + -1;
      Parser::extractBracket(this_00,&local_88,&local_118);
      if (local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar7 = 0;
        argCount = 0;
        do {
          iVar14 = (int)uVar7;
          psVar15 = local_118.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar7;
          pSVar6 = getPastScope(local_128,psVar15);
          if (pSVar6 == (Scope *)0x0) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            local_f0._M_string_length = 0;
            local_f0.field_2._M_local_buf[0] = '\0';
            local_148._16_8_ = (pointer)0x0;
            local_148._0_8_ = (pointer)0x0;
            local_148._8_8_ = (pointer)0x0;
            if (psVar15->_M_string_length != 0) {
              bVar12 = false;
              uVar7 = 0;
              uVar9 = 1;
              do {
                cVar1 = (psVar15->_M_dataplus)._M_p[uVar7];
                bVar12 = (bool)(cVar1 == '\"' ^ bVar12);
                if ((cVar1 != ' ') || (bVar12)) {
                  std::__cxx11::string::push_back((char)&local_f0);
                }
                else {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_148,&local_f0);
                  local_f0._M_string_length = 0;
                  *local_f0._M_dataplus._M_p = '\0';
                }
                bVar3 = uVar9 < psVar15->_M_string_length;
                uVar7 = uVar9;
                uVar9 = (ulong)((int)uVar9 + 1);
              } while (bVar3);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_148,&local_f0);
            psVar15 = (string *)(local_148._8_8_ + -0x20);
            iVar5 = std::__cxx11::string::compare((char *)psVar15);
            if (iVar5 == 0) {
              op = MATH_ADD;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)psVar15);
              if (iVar5 == 0) {
                op = MATH_SUBTRACT;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)psVar15);
                if (iVar5 == 0) {
                  op = MATH_MULTIPLY;
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)psVar15);
                  if (iVar5 == 0) {
                    op = MATH_DIVIDE;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)psVar15);
                    if (iVar5 == 0) {
                      op = MATH_MOD;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)psVar15);
                      if (iVar5 == 0) {
                        op = CONCENTRATE_STRINGS;
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)psVar15);
                        if (iVar5 == 0) {
                          op = COMPARE_EQUAL;
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)psVar15);
                          if (iVar5 == 0) {
                            op = COMPARE_UNEQUAL;
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)psVar15);
                            if (iVar5 == 0) {
                              op = COMPARE_LESS_THAN;
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)psVar15);
                              if (iVar5 == 0) {
                                op = COMPARE_MORE_THAN;
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)psVar15);
                                if (iVar5 == 0) {
                                  op = COMPARE_LESS_THAN_OR_EQUAL;
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)psVar15);
                                  if (iVar5 == 0) {
                                    op = COMPARE_MORE_THAN_OR_EQUAL;
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)psVar15);
                                    if (iVar5 == 0) {
                                      op = COMPARE_AND;
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)psVar15);
                                      op = -(uint)(iVar5 != 0) | COMPARE_OR;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            if (local_148._8_8_ - local_148._0_8_ == 0x20) {
              if (op == NONE) {
LAB_00107af8:
                evaluateBracket::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)local_128,psVar15);
                uVar10 = local_148._8_8_ - local_148._0_8_;
LAB_00107b28:
                uVar11 = (int)(uVar10 >> 5) + argCount;
              }
              else {
LAB_00107ade:
                uVar11 = 1;
                InstructionGenerator::genOperator(local_f8,op,argCount);
              }
            }
            else {
              uVar7 = 0;
              uVar9 = 1;
              local_11c = op;
              do {
                evaluateBracket::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)local_128,
                           (string *)(local_148._0_8_ + uVar7 * 0x20));
                uVar10 = local_148._8_8_ - local_148._0_8_;
                bVar12 = uVar9 < ((long)uVar10 >> 5) - 1U;
                uVar7 = uVar9;
                uVar9 = (ulong)((int)uVar9 + 1);
              } while (bVar12);
              if (local_11c == NONE) {
                if (uVar10 == 0x20) goto LAB_00107af8;
                argCount = argCount - 1;
                goto LAB_00107b28;
              }
              op = local_11c;
              if (uVar10 == 0x20) goto LAB_00107ade;
              InstructionGenerator::genOperator(local_f8,local_11c,(int)((long)uVar10 >> 5) - 1);
              uVar11 = argCount + 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
          }
          else {
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = (pointer)0x0;
            local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
            if (pSVar6->argumentCount != 0) {
              iVar14 = iVar14 + 1;
              std::__cxx11::string::_M_assign((string *)local_148);
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar2 = (psVar15->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar2,pcVar2 + psVar15->_M_string_length);
            local_d0[0] = local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_d0,local_148._0_8_,
                       (undefined1 *)
                       ((long)&((_Alloc_hider *)local_148._8_8_)->_M_p +
                       (long)&((_Alloc_hider *)local_148._0_8_)->_M_p));
            __l._M_len = 2;
            __l._M_array = &local_f0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_48,__l,&local_149);
            processFunction(local_128,&local_48,false);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            lVar8 = 0;
            do {
              if (local_c0 + lVar8 != *(undefined1 **)((long)local_d0 + lVar8)) {
                operator_delete(*(undefined1 **)((long)local_d0 + lVar8));
              }
              lVar8 = lVar8 + -0x20;
            } while (lVar8 != -0x40);
            if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
            uVar11 = argCount + 1;
            iVar14 = iVar14 + 1;
          }
          uVar7 = (ulong)(iVar14 + 1);
          argCount = uVar11;
        } while (uVar7 < (ulong)((long)local_118.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_118.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      psVar13 = local_90;
    } while (local_90 !=
             local_b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  return 0;
}

Assistant:

unsigned int Compiler::evaluateBracket(std::string originalLine)
{
    unsigned int variablesOnStack = 0;
    variablesOnStack = 0;
    auto addVariableToStack = [&] (const std::string &data) -> void
    {
        if(igen.isVariable(data) != -1) //If it's a variable
        {
            igen.genCloneTop(data);
        }
        else //Else if it's raw data
        {
            if(data[0] == '"') //If string
            {
                igen.genCreateString("", data.substr(1, data.size()-2));
            }
            else if(data[0] == '\'') //If character
            {
                igen.genCreateChar("", data[1]);
            }
            else if(data == "true") //If boolean
            {
                igen.genCreateBool("", true);
            }
            else if(data == "false") //If boolean
            {
                igen.genCreateBool("", false);
            }
            else //Else if number
            {
                igen.genCreateInt("", stoull(data));
            }
        }
    };

    auto handleSubSegment = [&] (const std::vector<std::string> &segments) -> void
    {
        //Get operator of bracket if any
        const std::string &segmentOperator = segments.back();
        //Check to see if it's a variable, if so, float to top of stack
        Instruction segmentInstruction = stringToInstruction(segmentOperator);
        for(unsigned int a = 0; a < segments.size()-1; a++)
        {
            addVariableToStack(segments[a]);
        }
        //If it's an instruction
        if(segmentInstruction != Instruction::NONE)
        {
            if(segments.size() == 1)
            {
                igen.genOperator(segmentInstruction, variablesOnStack);
                variablesOnStack = 0;
            }
            else
            {
                igen.genOperator(segmentInstruction, segments.size() - 1);
            }
            variablesOnStack++;
        }
        else //Else if its a piece of data
        {
            if(segments.size() == 1)
            {
                addVariableToStack(segmentOperator);
                variablesOnStack++;
            }
            variablesOnStack += segments.size()-1;
        }
    };

    //Split the arguments
    std::vector<std::string> &&arguments = parser.extractBracketArguments(originalLine);

    //Bracket all arguments, removing unneeded spaces
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0, 1);
        arg.insert(0, "(");
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
        arg += ")";
    }

    //Parse each argument separately
    for(auto iter = arguments.rbegin(); iter != arguments.rend(); iter++)
    {
        variablesOnStack = 0;
        const std::string &lineToParse = *iter;
        std::string line = parser.bracketOperatorFix(lineToParse);
        std::vector<std::string> components;
        parser.extractBracket(line, components);

        //Split segments by space
        for(unsigned int a = 0; a < components.size(); a++)
        {
            const std::string &segment = components[a];

            //If it's a function, call it
            Scope *possibleFunction = getPastScope(segment);
            if(possibleFunction != nullptr) //It's a function
            {
                //Take arguments from next segment only if the function accepts arguments
                std::string arg;
                if(possibleFunction->argumentCount > 0)
                    arg = components[++a];

                //Call it with the provided arguments if any, not destroying the return value
                processFunction({segment, arg}, false);
                variablesOnStack++;
                a++;
            }
            else //It's not a function
            {
                //Split by space
                std::string peiceBuffer;
                std::vector<std::string> subSegment;
                bool isQuoteOpen = false;
                for(unsigned int c = 0; c < segment.size(); c++)
                {
                    if(segment[c] == '"')
                        isQuoteOpen = !isQuoteOpen;
                    if(segment[c] == ' ' && isQuoteOpen == false)
                    {
                        subSegment.emplace_back(peiceBuffer);
                        peiceBuffer.clear();
                    }
                    else
                    {
                        peiceBuffer += segment[c];
                    }
                }
                subSegment.emplace_back(peiceBuffer);
                handleSubSegment(subSegment);
            }
        }
    }
    return 0;
}